

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O1

DWORD QueueUserAPC(PAPCFUNC pfnAPC,HANDLE hThread,ULONG_PTR dwData)

{
  PAL_ERROR PVar1;
  int iVar2;
  CPalThread *pThread;
  DWORD DVar3;
  CPalThread *local_40;
  CPalThread *pTargetThread;
  IPalObject *pTargetThreadObject;
  
  local_40 = (CPalThread *)0x0;
  pTargetThread = (CPalThread *)0x0;
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    DVar3 = 0;
    PVar1 = CorUnix::InternalGetThreadDataFromHandle
                      (pThread,hThread,0,&local_40,(IPalObject **)&pTargetThread);
    if (PVar1 == 0) {
      iVar2 = (**(code **)(*CorUnix::g_pSynchronizationManager + 0x10))
                        (CorUnix::g_pSynchronizationManager,pThread,local_40,pfnAPC,dwData);
      DVar3 = (DWORD)(iVar2 == 0);
    }
    else if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013f23b;
    if (pTargetThread != (CPalThread *)0x0) {
      (*pTargetThread->_vptr_CPalThread[8])(pTargetThread,pThread);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return DVar3;
    }
  }
LAB_0013f23b:
  abort();
}

Assistant:

DWORD
PALAPI
QueueUserAPC(
    PAPCFUNC pfnAPC,
    HANDLE hThread,
    ULONG_PTR dwData)
{
    CPalThread * pCurrentThread = NULL;
    CPalThread * pTargetThread = NULL;
    IPalObject * pTargetThreadObject = NULL;
    PAL_ERROR palErr;
    DWORD dwRet;

    PERF_ENTRY(QueueUserAPC);
    ENTRY("QueueUserAPC(pfnAPC=%p, hThread=%p, dwData=%#x)\n",
          pfnAPC, hThread, dwData);

    /* NOTE: Windows does not check the validity of pfnAPC, even if it is
       NULL.  It just does an access violation later on when the APC call
       is attempted */

    pCurrentThread = InternalGetCurrentThread();

    palErr = InternalGetThreadDataFromHandle(
        pCurrentThread,
        hThread,
        0, // THREAD_SET_CONTEXT
        &pTargetThread,
        &pTargetThreadObject
        );

    if (NO_ERROR != palErr)
    {
        ERROR("Unable to obtain thread data for handle %p (error %x)!\n",
                hThread, palErr);
        goto QueueUserAPC_exit;
    }


    palErr = g_pSynchronizationManager->QueueUserAPC(pCurrentThread, pTargetThread,
                                                     pfnAPC, dwData);

QueueUserAPC_exit:
    if (pTargetThreadObject)
    {
        pTargetThreadObject->ReleaseReference(pCurrentThread);
    }

    dwRet = (NO_ERROR == palErr) ? 1 : 0;

    LOGEXIT("QueueUserAPC returns DWORD %d\n", dwRet);
    PERF_EXIT(QueueUserAPC);
    return dwRet;
}